

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O0

AngularQuad IntegratorXX::angular_from_string(string *name)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  runtime_error *this;
  string *name_local;
  
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,toupper);
  bVar1 = std::operator==(name,"AHRENSBEYLKIN");
  if (bVar1) {
    name_local._4_4_ = AhrensBeylkin;
  }
  else {
    bVar1 = std::operator==(name,"AB");
    if (bVar1) {
      name_local._4_4_ = AhrensBeylkin;
    }
    else {
      bVar1 = std::operator==(name,"DELLEY");
      if (bVar1) {
        name_local._4_4_ = Delley;
      }
      else {
        bVar1 = std::operator==(name,"LEBEDEVLAIKOV");
        if (bVar1) {
          name_local._4_4_ = LebedevLaikov;
        }
        else {
          bVar1 = std::operator==(name,"LEBEDEV");
          if (bVar1) {
            name_local._4_4_ = LebedevLaikov;
          }
          else {
            bVar1 = std::operator==(name,"LL");
            if (bVar1) {
              name_local._4_4_ = LebedevLaikov;
            }
            else {
              bVar1 = std::operator==(name,"WOMERSLEY");
              if (!bVar1) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Angular Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              name_local._4_4_ = Womersley;
            }
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

AngularQuad angular_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "AHRENSBEYLKIN") return AngularQuad::AhrensBeylkin;
  if(name == "AB")            return AngularQuad::AhrensBeylkin;
  if(name == "DELLEY")        return AngularQuad::Delley;
  if(name == "LEBEDEVLAIKOV") return AngularQuad::LebedevLaikov;
  if(name == "LEBEDEV")       return AngularQuad::LebedevLaikov;
  if(name == "LL")            return AngularQuad::LebedevLaikov;
  if(name == "WOMERSLEY")     return AngularQuad::Womersley;

  throw std::runtime_error("Unrecognized Angular Quadrature");
}